

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::loadgulsummaryxref(summarycalc *this)

{
  FILE *pFVar1;
  int iVar2;
  long lVar3;
  char *__filename;
  undefined8 uVar4;
  size_t sVar5;
  reference pvVar6;
  int local_a0;
  int local_9c;
  int i;
  gulsummaryxref s;
  FILE *fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [55];
  allocator local_31;
  string local_30 [8];
  string file;
  summarycalc *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"input/gulsummaryxref.bin",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    std::__cxx11::string::substr((ulong)&fin,(ulong)local_30);
    std::operator+(local_68,&this->inputpath_);
    std::__cxx11::string::operator=(local_30,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)&fin);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  s._4_8_ = fopen(__filename,"rb");
  pFVar1 = _stderr;
  if ((FILE *)s._4_8_ == (FILE *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"FATAL: %s: Error opening file %s\n","loadgulsummaryxref",uVar4);
    exit(-1);
  }
  init_c_to_s(this);
  sVar5 = fread(&local_9c,0xc,1,(FILE *)s._4_8_);
  local_a0 = (int)sVar5;
  while( true ) {
    iVar2 = i;
    pFVar1 = _stderr;
    if (local_a0 == 0) {
      fclose((FILE *)s._4_8_);
      std::__cxx11::string::~string(local_30);
      return;
    }
    if (9 < s.coverage_id) break;
    if (this->fout[s.coverage_id] != (FILE *)0x0) {
      if (i < this->min_summary_id_[s.coverage_id]) {
        this->min_summary_id_[s.coverage_id] = i;
      }
      if (this->max_summary_id_[s.coverage_id] < i) {
        this->max_summary_id_[s.coverage_id] = i;
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (this->co_to_s_[s.coverage_id],(long)local_9c);
      *pvVar6 = iVar2;
    }
    sVar5 = fread(&local_9c,0xc,1,(FILE *)s._4_8_);
    local_a0 = (int)sVar5;
  }
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"FATAL: %s: Invalid summaryset id  %d found in %s\n","loadgulsummaryxref",
          (ulong)(uint)s.coverage_id,uVar4);
  exit(-1);
}

Assistant:

void summarycalc::loadgulsummaryxref()
{
	std::string file = GULSUMMARYXREF_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	FILE *fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__, file.c_str());
		::exit(-1);
	}

	init_c_to_s();
	gulsummaryxref s;
	int i = (int)fread(&s, sizeof(gulsummaryxref), 1, fin);
	while (i != 0) {
		if (s.summaryset_id > 9) {
			fprintf(stderr, "FATAL: %s: Invalid summaryset id  %d found in %s\n", __func__, s.summaryset_id, file.c_str());
			::exit(-1);
		}
		if (fout[s.summaryset_id] != nullptr) {
			if (s.summary_id < min_summary_id_[s.summaryset_id]) min_summary_id_[s.summaryset_id] = s.summary_id;
			if (s.summary_id > max_summary_id_[s.summaryset_id]) max_summary_id_[s.summaryset_id] = s.summary_id;
			(*co_to_s_[s.summaryset_id])[s.coverage_id] = s.summary_id ;
		}
		i = (int) fread(&s, sizeof(gulsummaryxref), 1, fin);
	}

	fclose(fin);
}